

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

StringIntMap * __thiscall
glcts::LayoutBindingProgram::getOffsets
          (StringIntMap *__return_storage_ptr__,LayoutBindingProgram *this,StringVector *param_1)

{
  StringVector *param_1_local;
  LayoutBindingProgram *this_local;
  
  memset(__return_storage_ptr__,0,0x30);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

virtual StringIntMap getOffsets(StringVector /*args*/) const
	{
		return StringIntMap();
	}